

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_boundary_at_node(REF_GRID ref_grid,REF_INT node)

{
  uint node1;
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  REF_NODE pRVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  REF_INT cell;
  REF_INT ncell;
  REF_INT cell_list [10];
  REF_INT ns [27];
  REF_INT nodes [27];
  uint local_168;
  int local_164;
  REF_NODE local_160;
  ulong local_158;
  long local_150;
  uint local_148 [12];
  uint local_118;
  uint local_114;
  uint local_110;
  undefined4 local_10c;
  REF_INT local_a8 [3];
  uint local_9c;
  
  ref_cell = ref_grid->cell[3];
  uVar7 = 0xffffffff;
  if (-1 < node) {
    uVar7 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar7 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar7 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar7].ref;
    local_160 = ref_grid->node;
    do {
      uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x68,"ref_validation_boundary_at_node",(ulong)uVar4,"get cell");
        return uVar4;
      }
      local_158 = uVar7;
      if (0 < ref_cell->edge_per) {
        local_150 = (long)cell;
        lVar8 = 0;
        do {
          lVar6 = ref_cell->size_per * local_150;
          uVar4 = ref_cell->c2n[ref_cell->e2n[lVar8 * 2] + lVar6];
          node1 = ref_cell->c2n[(long)(int)lVar6 + (long)ref_cell->e2n[lVar8 * 2 + 1]];
          iVar1 = local_160->ref_mpi->id;
          if ((iVar1 == local_160->part[(int)uVar4]) || (iVar1 == local_160->part[(int)node1])) {
            uVar5 = ref_cell_list_with2(ref_cell,uVar4,node1,10,&local_164,(REF_INT *)local_148);
            iVar1 = local_164;
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x73,"ref_validation_boundary_at_node",(ulong)uVar5,
                     "more than ten triangles found with two nodes");
              printf("nodes %d %d faceid %d\n",(ulong)uVar4,(ulong)node1,(ulong)local_9c);
              pRVar3 = local_160;
              ref_node_location(local_160,uVar4);
              ref_node_location(pRVar3,node1);
              return uVar5;
            }
            lVar6 = (long)local_164;
            if (lVar6 != 2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x7e,"ref_validation_boundary_at_node","two triangles expected",2,lVar6);
              printf("nodes %d %d faceid %d\n",(ulong)uVar4,(ulong)node1,(ulong)local_9c);
              pRVar3 = local_160;
              ref_node_location(local_160,uVar4);
              ref_node_location(pRVar3,node1);
              if (0 < local_164) {
                uVar7 = 0;
                do {
                  uVar4 = local_148[uVar7];
                  local_168 = ref_cell_nodes(ref_cell,uVar4,(REF_INT *)&local_118);
                  if (local_168 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                           ,0x7a,"ref_validation_boundary_at_node",(ulong)local_168,"get cell",lVar6
                          );
                    goto LAB_00206ee1;
                  }
                  lVar6 = CONCAT44((int)((ulong)lVar6 >> 0x20),local_10c);
                  printf(" item %d cell %d nodes %d %d %d id %d\n",uVar7 & 0xffffffff,(ulong)uVar4,
                         (ulong)local_118,(ulong)local_114,(ulong)local_110,lVar6);
                  uVar7 = uVar7 + 1;
                } while ((long)uVar7 < (long)local_164);
              }
              local_168 = 1;
            }
LAB_00206ee1:
            if (iVar1 != 2) {
              return local_168;
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < ref_cell->edge_per);
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)local_158].next;
      uVar7 = (ulong)iVar1;
      if (uVar7 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar7].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_at_node(REF_GRID ref_grid,
                                                   REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, c, ns[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1, ncell, cell_list[10];

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get cell");
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
        continue;
      RSB(ref_cell_list_with2(ref_cell, node0, node1, 10, &ncell, cell_list),
          "more than ten triangles found with two nodes", {
            printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
            ref_node_location(ref_node, node0);
            ref_node_location(ref_node, node1);
          });
      REIB(2, ncell, "two triangles expected", {
        printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
        ref_node_location(ref_node, node0);
        ref_node_location(ref_node, node1);
        for (i = 0; i < ncell; i++) {
          c = cell_list[i];
          RSS(ref_cell_nodes(ref_cell, c, ns), "get cell");
          printf(" item %d cell %d nodes %d %d %d id %d\n", i, c, ns[0], ns[1],
                 ns[2], ns[3]);
        }
      });
    }
  }

  return REF_SUCCESS;
}